

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O1

UniformBlock * __thiscall deqp::ub::ShaderInterface::allocBlock(ShaderInterface *this,char *name)

{
  UniformBlock *this_00;
  allocator<char> local_29;
  UniformBlock *local_28;
  
  std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>::reserve
            (&this->m_uniformBlocks,
             ((long)(this->m_uniformBlocks).
                    super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_uniformBlocks).
                    super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  this_00 = (UniformBlock *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,name,&local_29);
  (this_00->m_instanceName)._M_dataplus._M_p = (pointer)&(this_00->m_instanceName).field_2;
  (this_00->m_instanceName)._M_string_length = 0;
  (this_00->m_instanceName).field_2._M_local_buf[0] = '\0';
  (this_00->m_uniforms).super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_uniforms).super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_uniforms).super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->m_arraySize = 0;
  this_00->m_flags = 0;
  local_28 = this_00;
  std::vector<deqp::ub::UniformBlock*,std::allocator<deqp::ub::UniformBlock*>>::
  emplace_back<deqp::ub::UniformBlock*>
            ((vector<deqp::ub::UniformBlock*,std::allocator<deqp::ub::UniformBlock*>> *)
             &this->m_uniformBlocks,&local_28);
  return (this->m_uniformBlocks).
         super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

UniformBlock& ShaderInterface::allocBlock(const char* name)
{
	m_uniformBlocks.reserve(m_uniformBlocks.size() + 1);
	m_uniformBlocks.push_back(new UniformBlock(name));
	return *m_uniformBlocks.back();
}